

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

trie trie_suffixes(trie t,trie_key key)

{
  trie_node ptVar1;
  trie ptVar2;
  trie t_00;
  long in_RSI;
  trie_key in_RDI;
  trie_node_suffixes_iterator_args_type suffix_args;
  trie suffix_trie;
  trie_node node_iterator;
  trie_cb_compare in_stack_ffffffffffffffc8;
  trie ptVar3;
  trie_cb_hash in_stack_ffffffffffffffd0;
  trie in_stack_fffffffffffffff8;
  
  if (((in_RDI == (trie_key)0x0) || (in_RSI == 0)) ||
     (ptVar1 = trie_node_find(in_stack_fffffffffffffff8,in_RDI), ptVar1 == (trie_node)0x0)) {
    ptVar2 = (trie)0x0;
  }
  else {
    ptVar2 = trie_create(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (ptVar2 == (trie)0x0) {
      log_write_impl_va("metacall",0x306,"trie_suffixes",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                        ,3,"Trie invalid suffix trie creation");
      ptVar2 = (trie)0x0;
    }
    else {
      ptVar3 = ptVar2;
      t_00 = (trie)vector_create(0x1068a9);
      if (t_00 == (trie)0x0) {
        log_write_impl_va("metacall",0x311,"trie_suffixes",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                          ,3,"Trie invalid prefix vector creation",ptVar3);
        trie_destroy(t_00);
        ptVar2 = (trie)0x0;
      }
      else {
        trie_node_iterate(suffix_trie,(trie_node)suffix_args.prefixes,
                          (trie_cb_iterate)suffix_args.suffix_trie,in_stack_fffffffffffffff8);
        vector_destroy((vector)0x10691c);
      }
    }
  }
  return ptVar2;
}

Assistant:

trie trie_suffixes(trie t, trie_key key)
{
	if (t != NULL && key != NULL)
	{
		trie_node node_iterator = trie_node_find(t, key);

		if (node_iterator != NULL)
		{
			trie suffix_trie = trie_create(t->hash_cb, t->compare_cb);

			struct trie_node_suffixes_iterator_args_type suffix_args;

			if (suffix_trie == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid suffix trie creation");

				return NULL;
			}

			suffix_args.suffix_trie = suffix_trie;

			suffix_args.prefixes = vector_create(sizeof(trie_key));

			if (suffix_args.prefixes == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid prefix vector creation");

				trie_destroy(suffix_trie);

				return NULL;
			}

			trie_node_iterate(t, node_iterator, &trie_node_suffixes_cb_iterator, &suffix_args);

			vector_destroy(suffix_args.prefixes);

			return suffix_trie;
		}
	}

	return NULL;
}